

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O3

size_t zdd_nodecount_mark(ZDD zdd)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ulong *puVar5;
  
  lVar4 = (zdd & 0xffffffffff) * 0x10;
  uVar1 = *(ulong *)(nodes->data + lVar4);
  if ((uVar1 >> 0x3c & 1) == 0) {
    puVar5 = (ulong *)(nodes->data + lVar4);
    sVar3 = 0;
    do {
      *puVar5 = uVar1 | 0x1000000000000000;
      sVar2 = zdd_nodecount_mark(puVar5[1] & 0xffffffffff);
      sVar3 = sVar3 + 1 + sVar2;
      lVar4 = (*puVar5 & 0xffffffffff) * 0x10;
      puVar5 = (ulong *)(nodes->data + lVar4);
      uVar1 = *(ulong *)(nodes->data + lVar4);
    } while ((uVar1 & 0x1000000000000000) == 0);
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static size_t
zdd_nodecount_mark(ZDD zdd)
{
    // Note: the True/False leaf can be marked/unmarked, as buckets 0--1 are unused
    zddnode_t n = ZDD_GETNODE(zdd);
    if (zddnode_getmark(n)) return 0;
    zddnode_setmark(n, 1);
    return 1 + zdd_nodecount_mark(zddnode_getlow(n)) + zdd_nodecount_mark(zddnode_gethigh(n));
}